

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O0

void __thiscall KMeans::~KMeans(KMeans *this)

{
  KMeans *in_RDI;
  
  ~KMeans(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

KMeans::~KMeans()
{    
}